

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

String * doctest::toString(String *__return_storage_ptr__,double in)

{
  char *in_00;
  long lVar1;
  size_t sVar2;
  string d;
  ostringstream oss;
  char *local_1c8;
  long local_1c0;
  char local_1b8 [16];
  undefined1 *local_1a8 [2];
  undefined1 local_198 [16];
  long local_188;
  undefined8 local_180 [2];
  uint auStack_170 [22];
  ios_base local_118 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_188);
  *(undefined8 *)((long)local_180 + *(long *)(local_188 + -0x18)) = 10;
  *(uint *)((long)auStack_170 + *(long *)(local_188 + -0x18)) =
       *(uint *)((long)auStack_170 + *(long *)(local_188 + -0x18)) & 0xfffffefb | 4;
  std::ostream::_M_insert<double>(in);
  std::__cxx11::stringbuf::str();
  lVar1 = std::__cxx11::string::find_last_not_of((char)&local_1c8,0x30);
  if ((lVar1 != -1) && (lVar1 != local_1c0 + -1)) {
    std::__cxx11::string::substr((ulong)local_1a8,(ulong)&local_1c8);
    std::__cxx11::string::operator=((string *)&local_1c8,(string *)local_1a8);
    if (local_1a8[0] != local_198) {
      operator_delete(local_1a8[0]);
    }
  }
  in_00 = local_1c8;
  sVar2 = strlen(local_1c8);
  String::String(__return_storage_ptr__,in_00,(uint)sVar2);
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_188);
  std::ios_base::~ios_base(local_118);
  return __return_storage_ptr__;
}

Assistant:

String toString(double in) { return fpToString(in, 10); }